

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O0

void __thiscall
OpenMD::P2Z::P2Z(P2Z *this,SimInfo *info,string *filename,string *sele1,int seleOffset,
                int seleOffset2,uint nbins,int axis)

{
  undefined8 *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  SimInfo *in_stack_00000018;
  P2R *in_stack_00000020;
  string paramString;
  stringstream params;
  undefined4 in_stack_fffffffffffffd7c;
  StaticAnalyser *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [88];
  
  P2R::P2R(in_stack_00000020,in_stack_00000018,
           (string *)CONCAT44(in_stack_00000014,in_stack_00000010),
           (string *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,unaff_retaddr,
           (uint)paramString._M_string_length);
  *in_RDI = &PTR__P2Z_0055fc28;
  *(undefined4 *)((long)in_RDI + 0xd64) = in_stack_00000010;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x1ad);
  std::__cxx11::string::string((string *)__lhs);
  if (*(int *)((long)in_RDI + 0xd64) == 0) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x1ad),"x");
  }
  else if (*(int *)((long)in_RDI + 0xd64) == 1) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x1ad),"y");
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x1ad),"z");
  }
  std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffd80);
  StaticAnalyser::setAnalysisType
            (in_stack_fffffffffffffd80,
             (string *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_00000008));
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  getPrefix(__lhs);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffd80);
  StaticAnalyser::setOutputName
            (in_stack_fffffffffffffd80,
             (string *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_00000008));
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffdc0);
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString
            (in_stack_fffffffffffffd80,
             (string *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_00000008));
  std::__cxx11::string::~string(local_260);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffdc0);
  return;
}

Assistant:

P2Z::P2Z(SimInfo* info, const std::string& filename, const std::string& sele1,
           int seleOffset, int seleOffset2, unsigned int nbins, int axis) :
      P2R(info, filename, sele1, seleOffset, seleOffset2, nbins),
      axis_(axis) {
    switch (axis_) {
    case 0:
      axisLabel_ = "x";
      break;
    case 1:
      axisLabel_ = "y";
      break;
    case 2:
    default:
      axisLabel_ = "z";
      break;
    }

    setAnalysisType("2nd order Legendre Polynomial Correlation using " +
                    axisLabel_ + " as reference axis");
    setOutputName(getPrefix(filename) + ".P2Z");
    std::stringstream params;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }